

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

uv_os_sock_t create_bound_socket(sockaddr_in bind_addr)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  undefined8 uStack_30;
  int yes;
  sockaddr_in bind_addr_local;
  
  bind_addr_local.sin_zero = bind_addr.sin_zero;
  bind_addr_local._0_8_ = bind_addr._0_8_;
  __fd = socket(2,1,0);
  if (__fd < 0) {
    pcVar2 = "sock >= 0";
    uStack_30 = 0x6f;
  }
  else {
    yes = 1;
    iVar1 = setsockopt(__fd,1,2,&yes,4);
    if (iVar1 == 0) {
      iVar1 = bind(__fd,(sockaddr *)&bind_addr_local,0x10);
      if (iVar1 == 0) {
        return __fd;
      }
      pcVar2 = "r == 0";
      uStack_30 = 0x7c;
    }
    else {
      pcVar2 = "r == 0";
      uStack_30 = 0x77;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-poll.c"
          ,uStack_30,pcVar2);
  abort();
}

Assistant:

static uv_os_sock_t create_bound_socket (struct sockaddr_in bind_addr) {
  uv_os_sock_t sock;
  int r;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT(sock != INVALID_SOCKET);
#else
  ASSERT(sock >= 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT(r == 0);
  }
#endif

  r = bind(sock, (const struct sockaddr*) &bind_addr, sizeof bind_addr);
  ASSERT(r == 0);

  return sock;
}